

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O3

int portability_path_is_pattern(char *path,size_t size)

{
  ulong uVar1;
  char cVar2;
  
  if ((size != 0 && path != (char *)0x0) && (cVar2 = *path, cVar2 != '\0')) {
    uVar1 = 1;
    do {
      if (cVar2 == '*') {
        return 0;
      }
      if (size <= uVar1) {
        return 1;
      }
      cVar2 = path[uVar1];
      uVar1 = uVar1 + 1;
    } while (cVar2 != '\0');
  }
  return 1;
}

Assistant:

int portability_path_is_pattern(const char *path, size_t size)
{
	if (path == NULL || size == 0)
	{
		return 1;
	}

	size_t i;

	for (i = 0; path[i] != '\0' && i < size; ++i)
	{
		if (path[i] == '*')
		{
			return 0;
		}
	}

	return 1;
}